

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merged-constraint.cpp
# Opt level: O2

void baryonyx::itm::
     fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
               (context *ctx,
               unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
               *cache,operator_type op,problem *pb,
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *ret)

{
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *pvVar1;
  constraint *pcVar2;
  pointer pmVar3;
  long lVar4;
  iterator iVar5;
  problem_definition_failure *this;
  int iVar6;
  int iVar7;
  int *piVar8;
  long local_68;
  int local_5c;
  context *local_58;
  string local_50;
  
  if (op == less) {
    pcVar2 = (pb->less_constraints).
             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (piVar8 = &((pb->less_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start)->id;
        (constraint *)(piVar8 + -0xb) != pcVar2; piVar8 = piVar8 + 0xc) {
      pvVar1 = (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *)
               (piVar8 + -7);
      iVar5 = std::
              _Hashtable<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_baryonyx::itm::merged_constraint_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&cache->_M_h,pvVar1);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
          ._M_cur == (__node_type *)0x0) {
        local_68 = ((long)(ret->
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(ret->
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x28;
        std::
        _Hashtable<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,baryonyx::itm::merged_constraint_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const&,unsigned_long>
                  ((_Hashtable<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,baryonyx::itm::merged_constraint_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)cache,pvVar1,&local_68);
        local_68 = CONCAT44(local_68._4_4_,0x80000000);
        local_5c = piVar8[-1];
        std::
        vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>::
        emplace_back<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const&,int,int,int_const&>
                  ((vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>
                    *)ret,pvVar1,(int *)&local_68,&local_5c,piVar8);
      }
      else {
        pmVar3 = (ret->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar7 = pmVar3[*(long *)((long)iVar5.
                                       super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                       ._M_cur + 0x20)].max;
        if (piVar8[-1] < iVar7) {
          iVar7 = piVar8[-1];
        }
        pmVar3[*(long *)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                               ._M_cur + 0x20)].max = iVar7;
      }
    }
  }
  else if (op == greater) {
    pcVar2 = (pb->greater_constraints).
             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (piVar8 = &((pb->greater_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start)->value;
        (constraint *)(piVar8 + -10) != pcVar2; piVar8 = piVar8 + 0xc) {
      pvVar1 = (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *)
               (piVar8 + -6);
      iVar5 = std::
              _Hashtable<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_baryonyx::itm::merged_constraint_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&cache->_M_h,pvVar1);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
          ._M_cur == (__node_type *)0x0) {
        local_68 = ((long)(ret->
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(ret->
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x28;
        std::
        _Hashtable<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,baryonyx::itm::merged_constraint_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const&,unsigned_long>
                  ((_Hashtable<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,baryonyx::itm::merged_constraint_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)cache,pvVar1,&local_68);
        local_68 = CONCAT44(local_68._4_4_,0x7fffffff);
        std::
        vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>::
        emplace_back<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const&,int_const&,int,int_const&>
                  ((vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>
                    *)ret,pvVar1,piVar8,(int *)&local_68,piVar8 + 1);
      }
      else {
        pmVar3 = (ret->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar7 = pmVar3[*(long *)((long)iVar5.
                                       super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                       ._M_cur + 0x20)].min;
        iVar6 = *piVar8;
        if (*piVar8 < iVar7) {
          iVar6 = iVar7;
        }
        pmVar3[*(long *)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                               ._M_cur + 0x20)].min = iVar6;
      }
    }
  }
  else {
    pcVar2 = (pb->equal_constraints).
             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl
             .super__Vector_impl_data._M_finish;
    local_58 = ctx;
    for (piVar8 = &((pb->equal_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start)->id;
        (constraint *)(piVar8 + -0xb) != pcVar2; piVar8 = piVar8 + 0xc) {
      pvVar1 = (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *)
               (piVar8 + -7);
      iVar5 = std::
              _Hashtable<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_baryonyx::itm::merged_constraint_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&cache->_M_h,pvVar1);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
          ._M_cur == (__node_type *)0x0) {
        local_68 = ((long)(ret->
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(ret->
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x28;
        std::
        _Hashtable<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,baryonyx::itm::merged_constraint_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const&,unsigned_long>
                  ((_Hashtable<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,baryonyx::itm::merged_constraint_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)cache,pvVar1,&local_68);
        local_5c = piVar8[-1];
        local_68 = CONCAT44(local_68._4_4_,local_5c);
        std::
        vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>::
        emplace_back<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const&,int,int,int_const&>
                  ((vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>
                    *)ret,pvVar1,(int *)&local_68,&local_5c,piVar8);
      }
      else {
        lVar4 = *(long *)((long)iVar5.
                                super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                ._M_cur + 0x20);
        pmVar3 = (ret->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar7 = piVar8[-1];
        if ((iVar7 < pmVar3[lVar4].min) || (pmVar3[lVar4].max < iVar7)) {
          error<int,int>(local_58,"Constraint {}: is inconsistent with previous {}.\n",piVar8,
                         &pmVar3[lVar4].id);
          this = (problem_definition_failure *)__cxa_allocate_exception(0x38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"equal",(allocator<char> *)&local_68);
          problem_definition_failure::problem_definition_failure(this,&local_50,multiple_constraint)
          ;
          __cxa_throw(this,&problem_definition_failure::typeinfo,
                      problem_definition_failure::~problem_definition_failure);
        }
        pmVar3[lVar4].min = iVar7;
        pmVar3[lVar4].max = iVar7;
      }
    }
  }
  return;
}

Assistant:

static void
fill_merged_constraints(const baryonyx::context& ctx,
                        cacheT& cache,
                        baryonyx::operator_type op,
                        const baryonyx::problem& pb,
                        retT& ret)
{
    switch (op) {
    case baryonyx::operator_type::equal:
        for (const auto& elem : pb.equal_constraints) {
            auto it = cache.find(elem.elements);
            if (it == cache.end()) {
                cache.emplace(elem.elements, ret.size());
                ret.emplace_back(elem.elements,
                                 baryonyx::numeric_cast<int>(elem.value),
                                 baryonyx::numeric_cast<int>(elem.value),
                                 elem.id);
            } else {
                if (ret[it->second].min <= elem.value &&
                    elem.value <= ret[it->second].max) {
                    ret[it->second].min = elem.value;
                    ret[it->second].max = elem.value;
                } else {
                    error(ctx,
                          "Constraint {}: is inconsistent with previous {}.\n",
                          elem.id,
                          ret[it->second].id);

                    throw problem_definition_failure(
                      "equal",
                      problem_definition_error_tag::multiple_constraint);
                }
            }
        }
        break;
    case baryonyx::operator_type::less:
        for (const auto& elem : pb.less_constraints) {
            auto it = cache.find(elem.elements);
            if (it == cache.end()) {
                cache.emplace(elem.elements, ret.size());
                ret.emplace_back(elem.elements,
                                 std::numeric_limits<int>::min(),
                                 baryonyx::numeric_cast<int>(elem.value),
                                 elem.id);
            } else {
                ret[it->second].max =
                  std::min(ret[it->second].max,
                           baryonyx::numeric_cast<int>(elem.value));
            }
        }
        break;
    case baryonyx::operator_type::greater:
        for (const auto& elem : pb.greater_constraints) {
            auto it = cache.find(elem.elements);
            if (it == cache.end()) {
                cache.emplace(elem.elements, ret.size());
                ret.emplace_back(elem.elements,
                                 elem.value,
                                 std::numeric_limits<int>::max(),
                                 elem.id);
            } else {
                ret[it->second].min =
                  std::max(ret[it->second].min,
                           baryonyx::numeric_cast<int>(elem.value));
            }
        }
        break;
    default:
        break;
    }
}